

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::hoopla_permute(size_t *B,size_t *end)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  unsigned_long *__i;
  size_t __n;
  ulong *puVar4;
  ulong *puVar5;
  unsigned_long *__ptr;
  ulong uVar6;
  ulong uVar7;
  value_type_conflict2 __val_2;
  size_t *psVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  size_t __n_00;
  ulong uVar19;
  value_type_conflict2 __val;
  
  uVar18 = (long)end - (long)B >> 3;
  __n = (long)end - (long)B;
  if (__n != 0) {
    lVar2 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
              (B,end,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x12d33d);
    puVar5 = B + 1;
    puVar16 = B;
    if ((long)__n < 0x81) {
      while (puVar9 = puVar5, puVar9 != end) {
        uVar6 = *puVar9;
        if (uVar6 < *B) {
          memmove((void *)((long)puVar16 + (0x10 - ((long)puVar9 - (long)B))),B,
                  (long)puVar9 - (long)B);
          puVar5 = B;
        }
        else {
          uVar7 = *puVar16;
          puVar5 = puVar9;
          while (uVar6 < uVar7) {
            *puVar5 = uVar7;
            puVar16 = puVar5 + -2;
            puVar5 = puVar5 + -1;
            uVar7 = *puVar16;
          }
        }
        *puVar5 = uVar6;
        puVar16 = puVar9;
        puVar5 = puVar9 + 1;
      }
    }
    else {
      __n_00 = 8;
      psVar8 = B;
      puVar16 = puVar5;
      do {
        puVar9 = (ulong *)((long)B + __n_00);
        uVar6 = *(ulong *)((long)B + __n_00);
        if (uVar6 < *B) {
          memmove(puVar5,B,__n_00);
          puVar4 = B;
        }
        else {
          uVar7 = *psVar8;
          puVar4 = puVar9;
          puVar3 = puVar16;
          while (uVar6 < uVar7) {
            *puVar3 = uVar7;
            puVar4 = puVar3 + -1;
            uVar7 = puVar3[-2];
            puVar3 = puVar4;
          }
        }
        *puVar4 = uVar6;
        __n_00 = __n_00 + 8;
        puVar16 = puVar16 + 1;
        psVar8 = puVar9;
      } while (__n_00 != 0x80);
      for (puVar5 = B + 0x10; puVar5 != end; puVar5 = puVar5 + 1) {
        uVar7 = *puVar5;
        uVar6 = puVar5[-1];
        puVar16 = puVar5;
        while (uVar7 < uVar6) {
          *puVar16 = uVar6;
          puVar9 = puVar16 + -2;
          puVar16 = puVar16 + -1;
          uVar6 = *puVar9;
        }
        *puVar16 = uVar7;
      }
    }
  }
  __ptr = calloc_or_throw<unsigned_long>(uVar18 * 2 + 2);
  *(size_t *)((long)__ptr + __n) = *B;
  uVar6 = uVar18 - 1;
  __ptr[uVar18 + 1] = B[uVar18 - 1];
  if (1 < uVar6) {
    uVar7 = uVar18 + 1;
    uVar17 = 1;
    uVar11 = 0;
    do {
      uVar1 = B[uVar6 - 1];
      uVar19 = __ptr[uVar7];
      uVar12 = B[uVar17];
      uVar14 = uVar19 - uVar1;
      if (uVar19 < uVar1) {
        uVar14 = -(uVar19 - uVar1);
      }
      uVar13 = uVar19 - uVar12;
      if (uVar19 < uVar12) {
        uVar13 = -(uVar19 - uVar12);
      }
      uVar19 = __ptr[uVar18];
      uVar15 = uVar19 - uVar1;
      if (uVar19 < uVar1) {
        uVar15 = -(uVar19 - uVar1);
      }
      uVar10 = uVar19 - uVar12;
      if (uVar19 < uVar12) {
        uVar10 = -(uVar19 - uVar12);
      }
      uVar19 = uVar15;
      if (uVar15 < uVar10) {
        uVar19 = uVar10;
      }
      if (uVar14 < uVar13) {
        uVar14 = uVar13;
      }
      if (uVar14 < uVar19) {
        uVar14 = uVar19;
      }
      if (uVar10 < uVar14) {
        if (uVar15 < uVar14) {
          if (uVar14 <= uVar13) {
            uVar7 = uVar7 + 1;
            uVar19 = uVar7;
            uVar11 = uVar17;
            goto LAB_001257e4;
          }
          uVar7 = uVar7 + 1;
          uVar19 = uVar7;
        }
        else {
          uVar19 = uVar18 - 1;
          uVar18 = uVar19;
        }
        uVar6 = uVar6 - 1;
        uVar12 = uVar1;
      }
      else {
        uVar19 = uVar18 - 1;
        uVar11 = uVar17;
        uVar18 = uVar19;
      }
LAB_001257e4:
      __ptr[uVar19] = uVar12;
      uVar17 = uVar11 + 1;
    } while (uVar17 < uVar6);
  }
  memcpy(B,__ptr + uVar18,__n);
  free(__ptr);
  return;
}

Assistant:

void hoopla_permute(size_t* B, size_t* end)
{
  // from Curtis IPL 2004, "Darts and hoopla board design"
  // first sort
  size_t N = end - B;
  std::sort(B, end, cmp_size_t);
  // make some temporary space
  size_t* A = calloc_or_throw<size_t>((N + 1) * 2);
  A[N] = B[0];                // arbitrarily choose the maximum in the middle
  A[N + 1] = B[N - 1];        // so the maximum goes next to it
  size_t lo = N, hi = N + 1;  // which parts of A have we filled in? [lo,hi]
  size_t i = 0, j = N - 1;    // which parts of B have we already covered? [0,i] and [j,N-1]
  while (i + 1 < j)
  {
    // there are four options depending on where things get placed
    size_t d1 = absdiff(A[lo], B[i + 1]);  // put B[i+1] at the bottom
    size_t d2 = absdiff(A[lo], B[j - 1]);  // put B[j-1] at the bottom
    size_t d3 = absdiff(A[hi], B[i + 1]);  // put B[i+1] at the top
    size_t d4 = absdiff(A[hi], B[j - 1]);  // put B[j-1] at the top
    size_t mx = max(max(d1, d2), max(d3, d4));
    if (d1 >= mx)
      A[--lo] = B[++i];
    else if (d2 >= mx)
      A[--lo] = B[--j];
    else if (d3 >= mx)
      A[++hi] = B[++i];
    else
      A[++hi] = B[--j];
  }
  // copy it back to B
  memcpy(B, A + lo, N * sizeof(size_t));
  // clean up
  free(A);
}